

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::addUniqueAttribute
          (GLShaderProgram *this,ShaderSpecAttribute *newAttribute)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pGVar2;
  size_t sVar3;
  size_t __n;
  pointer pcVar4;
  int iVar5;
  GLShaderAttribute *a;
  pointer pGVar6;
  bool bVar7;
  GLShaderAttribute local_68;
  
  pGVar6 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = pGVar6 == pGVar2;
  if (!bVar7) {
    sVar3 = (newAttribute->name)._M_string_length;
    do {
      __n = (pGVar6->name)._M_string_length;
      if ((__n == sVar3) &&
         (((__n == 0 ||
           (iVar5 = bcmp((pGVar6->name)._M_dataplus._M_p,(newAttribute->name)._M_dataplus._M_p,__n),
           iVar5 == 0)) && (pGVar6->type == newAttribute->type)))) {
        if (!bVar7) {
          return;
        }
        break;
      }
      pGVar6 = pGVar6 + 1;
      bVar7 = pGVar6 == pGVar2;
    } while (!bVar7);
  }
  paVar1 = &local_68.name.field_2;
  pcVar4 = (newAttribute->name)._M_dataplus._M_p;
  local_68.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar4,pcVar4 + (newAttribute->name)._M_string_length);
  local_68.type = newAttribute->type;
  local_68.arrayCount = newAttribute->arrayCount;
  local_68.dataSize = -1;
  local_68.location = 0x309;
  local_68.VBOLoc = 0x309;
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  ::emplace_back<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>
            (&this->attributes,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GLShaderProgram::addUniqueAttribute(ShaderSpecAttribute newAttribute) {
  for (GLShaderAttribute& a : attributes) {
    if (a.name == newAttribute.name && a.type == newAttribute.type) {
      return;
    }
  }
  attributes.push_back(GLShaderAttribute{newAttribute.name, newAttribute.type, newAttribute.arrayCount, -1, 777, 777});
}